

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

optional<std::shared_ptr<IdentifierExpressionAstNode>_> * __thiscall
Parser::parseIdentiferExpression
          (optional<std::shared_ptr<IdentifierExpressionAstNode>_> *__return_storage_ptr__,
          Parser *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  shared_ptr<Token> token;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_40;
  undefined1 local_2a;
  undefined1 local_29;
  bool error;
  
  local_29 = 0;
  token.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = &local_40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&token.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             "Expected an identifer","");
  expect((Parser *)&stack0xffffffffffffffa0,(TokenType)this,(bool *)0x18,(string *)&local_29);
  if (token.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi != &local_40) {
    operator_delete(token.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
                    (long)local_40._vptr__Sp_counted_base + 1);
  }
  token.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<IdentifierExpressionAstNode,std::allocator<IdentifierExpressionAstNode>,std::shared_ptr<Token>&>
            (&local_48,
             (IdentifierExpressionAstNode **)
             &token.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (allocator<IdentifierExpressionAstNode> *)&local_2a,
             (shared_ptr<Token> *)&stack0xffffffffffffffa0);
  _Var1._M_pi = local_48._M_pi;
  (__return_storage_ptr__->
  super__Optional_base<std::shared_ptr<IdentifierExpressionAstNode>,_false,_false>)._M_payload.
  super__Optional_payload<std::shared_ptr<IdentifierExpressionAstNode>,_true,_false,_false>.
  super__Optional_payload_base<std::shared_ptr<IdentifierExpressionAstNode>_>._M_payload._M_value.
  super___shared_ptr<IdentifierExpressionAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)token.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  (__return_storage_ptr__->
  super__Optional_base<std::shared_ptr<IdentifierExpressionAstNode>,_false,_false>)._M_payload.
  super__Optional_payload<std::shared_ptr<IdentifierExpressionAstNode>,_true,_false,_false>.
  super__Optional_payload_base<std::shared_ptr<IdentifierExpressionAstNode>_>._M_payload._M_value.
  super___shared_ptr<IdentifierExpressionAstNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_48._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (__return_storage_ptr__->
  super__Optional_base<std::shared_ptr<IdentifierExpressionAstNode>,_false,_false>)._M_payload.
  super__Optional_payload<std::shared_ptr<IdentifierExpressionAstNode>,_true,_false,_false>.
  super__Optional_payload_base<std::shared_ptr<IdentifierExpressionAstNode>_>._M_payload._M_value.
  super___shared_ptr<IdentifierExpressionAstNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var1._M_pi;
  token.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (__return_storage_ptr__->
  super__Optional_base<std::shared_ptr<IdentifierExpressionAstNode>,_false,_false>)._M_payload.
  super__Optional_payload<std::shared_ptr<IdentifierExpressionAstNode>,_true,_false,_false>.
  super__Optional_payload_base<std::shared_ptr<IdentifierExpressionAstNode>_>._M_engaged = true;
  if (token.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               token.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  return __return_storage_ptr__;
}

Assistant:

const std::optional<std::shared_ptr<IdentifierExpressionAstNode>>
Parser::parseIdentiferExpression() noexcept {
  bool error = false;
  auto token = this->expect(TokenType::Identifier, error, "Expected an identifer");
  return std::make_shared<IdentifierExpressionAstNode>(token);
}